

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::CollationIterator::appendNumericSegmentCEs
          (CollationIterator *this,char *digits,int32_t length,UErrorCode *errorCode)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  uVar2 = this->data->numericPrimary;
  if (length < 8) {
    uVar9 = (uint)*digits;
    uVar7 = (ulong)length;
    for (lVar4 = 1; lVar4 < (long)uVar7; lVar4 = lVar4 + 1) {
      uVar9 = (int)digits[lVar4] + uVar9 * 10;
    }
    if ((int)uVar9 < 0x4a) {
      uVar7 = (ulong)(uVar9 * 0x10000 + 0x20000 | uVar2);
      goto LAB_002452f4;
    }
    if (uVar9 < 0x27fa) {
      uVar9 = uVar9 - 0x4a & 0xffff;
      uVar7 = (ulong)((uVar9 % 0xfe) * 0x100 + 0x200 | uVar2 | (uVar9 / 0xfe) * 0x10000 + 0x4c0000);
      goto LAB_002452f4;
    }
    if (uVar9 < 0xfe83a) {
      uVar9 = uVar9 - 0x27fa;
      uVar7 = (ulong)((uVar9 / 0xfc04) * 0x10000 + uVar9 % 0xfe + 0x740002 | uVar2 |
                     ((uint)(ushort)((ulong)uVar9 / 0xfe) % 0xfe) * 0x100 + 0x200);
      goto LAB_002452f4;
    }
  }
  else {
    uVar7 = (ulong)(uint)length;
  }
  lVar4 = 1;
  uVar9 = ((length + 1) / 2) * 0x10000 + 0x800000U | uVar2;
  lVar3 = uVar7 << 0x20;
  do {
    lVar11 = lVar3;
    uVar8 = uVar7;
    if (digits[uVar8 - 1] != '\0') break;
    uVar7 = uVar8 - 2;
    lVar3 = lVar11 + -0x200000000;
  } while (digits[uVar8 - 2] == '\0');
  iVar10 = (int)*digits;
  if ((uVar8 & 1) == 0) {
    iVar10 = (int)digits[1] + iVar10 * 10;
    lVar4 = 2;
  }
  iVar6 = 8;
  for (; bVar5 = (byte)iVar6, lVar4 < lVar11 >> 0x20; lVar4 = lVar4 + 2) {
    uVar1 = iVar10 * 2 + 0xb;
    if (iVar6 == 0) {
      CEBuffer::append(&this->ceBuffer,(ulong)(uVar1 | uVar9) << 0x20 | 0x5000500,errorCode);
      iVar6 = 0x10;
      uVar9 = uVar2;
    }
    else {
      iVar6 = iVar6 + -8;
      uVar9 = uVar1 << (bVar5 & 0x1f) | uVar9;
    }
    iVar10 = (int)digits[lVar4 + 1] + digits[lVar4] * 10;
  }
  uVar7 = (ulong)(iVar10 * 2 + 10 << (bVar5 & 0x1f) | uVar9);
LAB_002452f4:
  CEBuffer::append(&this->ceBuffer,uVar7 << 0x20 | 0x5000500,errorCode);
  return;
}

Assistant:

void
CollationIterator::appendNumericSegmentCEs(const char *digits, int32_t length, UErrorCode &errorCode) {
    U_ASSERT(1 <= length && length <= 254);
    U_ASSERT(length == 1 || digits[0] != 0);
    uint32_t numericPrimary = data->numericPrimary;
    // Note: We use primary byte values 2..255: digits are not compressible.
    if(length <= 7) {
        // Very dense encoding for small numbers.
        int32_t value = digits[0];
        for(int32_t i = 1; i < length; ++i) {
            value = value * 10 + digits[i];
        }
        // Primary weight second byte values:
        //     74 byte values   2.. 75 for small numbers in two-byte primary weights.
        //     40 byte values  76..115 for medium numbers in three-byte primary weights.
        //     16 byte values 116..131 for large numbers in four-byte primary weights.
        //    124 byte values 132..255 for very large numbers with 4..127 digit pairs.
        int32_t firstByte = 2;
        int32_t numBytes = 74;
        if(value < numBytes) {
            // Two-byte primary for 0..73, good for day & month numbers etc.
            uint32_t primary = numericPrimary | ((firstByte + value) << 16);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes;
        firstByte += numBytes;
        numBytes = 40;
        if(value < numBytes * 254) {
            // Three-byte primary for 74..10233=74+40*254-1, good for year numbers and more.
            uint32_t primary = numericPrimary |
                ((firstByte + value / 254) << 16) | ((2 + value % 254) << 8);
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        value -= numBytes * 254;
        firstByte += numBytes;
        numBytes = 16;
        if(value < numBytes * 254 * 254) {
            // Four-byte primary for 10234..1042489=10234+16*254*254-1.
            uint32_t primary = numericPrimary | (2 + value % 254);
            value /= 254;
            primary |= (2 + value % 254) << 8;
            value /= 254;
            primary |= (firstByte + value % 254) << 16;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            return;
        }
        // original value > 1042489
    }
    U_ASSERT(length >= 7);

    // The second primary byte value 132..255 indicates the number of digit pairs (4..127),
    // then we generate primary bytes with those pairs.
    // Omit trailing 00 pairs.
    // Decrement the value for the last pair.

    // Set the exponent. 4 pairs->132, 5 pairs->133, ..., 127 pairs->255.
    int32_t numPairs = (length + 1) / 2;
    uint32_t primary = numericPrimary | ((132 - 4 + numPairs) << 16);
    // Find the length without trailing 00 pairs.
    while(digits[length - 1] == 0 && digits[length - 2] == 0) {
        length -= 2;
    }
    // Read the first pair.
    uint32_t pair;
    int32_t pos;
    if(length & 1) {
        // Only "half a pair" if we have an odd number of digits.
        pair = digits[0];
        pos = 1;
    } else {
        pair = digits[0] * 10 + digits[1];
        pos = 2;
    }
    pair = 11 + 2 * pair;
    // Add the pairs of digits between pos and length.
    int32_t shift = 8;
    while(pos < length) {
        if(shift == 0) {
            // Every three pairs/bytes we need to store a 4-byte-primary CE
            // and start with a new CE with the '0' primary lead byte.
            primary |= pair;
            ceBuffer.append(Collation::makeCE(primary), errorCode);
            primary = numericPrimary;
            shift = 16;
        } else {
            primary |= pair << shift;
            shift -= 8;
        }
        pair = 11 + 2 * (digits[pos] * 10 + digits[pos + 1]);
        pos += 2;
    }
    primary |= (pair - 1) << shift;
    ceBuffer.append(Collation::makeCE(primary), errorCode);
}